

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O3

int jpc_com_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  int iVar1;
  uchar *buf;
  int iVar2;
  size_t size;
  
  iVar1 = jpc_getuint16(in,(uint_fast16_t *)&(ms->parms).soc);
  iVar2 = -1;
  if (iVar1 == 0) {
    size = ms->len - 2;
    (ms->parms).sot.len = size;
    if (size == 0) {
      (ms->parms).siz.height = 0;
    }
    else {
      buf = (uchar *)jas_malloc(size);
      (ms->parms).ppm.data = buf;
      if (buf == (uchar *)0x0) {
        return -1;
      }
      iVar1 = jas_stream_read(in,buf,*(uint *)((long)&ms->parms + 8));
      if (iVar1 != *(int *)((long)&ms->parms + 8)) {
        return -1;
      }
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int jpc_com_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_com_t *com = &ms->parms.com;

	/* Eliminate compiler warning about unused variables. */
	(void)cstate;

	if (jpc_getuint16(in, &com->regid)) {
		return -1;
	}
	com->len = ms->len - 2;
	if (com->len > 0) {
		if (!(com->data = jas_malloc(com->len))) {
			return -1;
		}
		if (jas_stream_read(in, com->data, com->len) != JAS_CAST(int, com->len)) {
			return -1;
		}
	} else {
		com->data = 0;
	}
	return 0;
}